

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O1

void sha256_datasrc(char *buf,CVmDataSource *src,unsigned_long len)

{
  char *pcVar1;
  char cVar2;
  char cVar4;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  byte bVar26;
  undefined1 auVar27 [15];
  undefined1 auVar28 [14];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  ushort uVar31;
  undefined1 auVar32 [15];
  undefined1 auVar33 [14];
  ushort uVar34;
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  unkuint9 Var40;
  undefined1 auVar41 [11];
  undefined1 auVar42 [14];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  uint6 uVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  int iVar49;
  long lVar50;
  ulong uVar51;
  short sVar52;
  ushort uVar61;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  short sVar62;
  uint uVar63;
  uint uVar72;
  int iVar73;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  uint uVar77;
  uint uVar83;
  int iVar84;
  undefined1 auVar78 [16];
  int iVar85;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  byte bVar99;
  byte bVar101;
  byte bVar103;
  byte bVar105;
  byte bVar107;
  byte bVar109;
  undefined1 auVar86 [11];
  undefined1 auVar89 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  sha256_ctx ctx;
  uchar hash [32];
  sha256_ctx local_4a0;
  ulong local_438 [129];
  char cVar3;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  undefined4 uVar53;
  undefined6 uVar54;
  undefined8 uVar55;
  undefined1 auVar56 [12];
  undefined1 auVar57 [14];
  undefined4 uVar64;
  undefined6 uVar65;
  undefined8 uVar66;
  undefined1 auVar67 [12];
  undefined1 auVar68 [14];
  undefined1 auVar71 [16];
  undefined1 auVar90 [16];
  undefined1 auVar87 [12];
  undefined1 auVar91 [16];
  undefined1 auVar88 [13];
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  undefined1 auVar93 [16];
  char cVar100;
  char cVar102;
  char cVar104;
  char cVar106;
  char cVar108;
  char cVar110;
  byte bVar111;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  
  local_4a0.count[0] = 0;
  local_4a0.count[1] = 0;
  local_4a0.hash[0] = 0x6a09e667;
  local_4a0.hash[1] = 0xbb67ae85;
  local_4a0.hash[2] = 0x3c6ef372;
  local_4a0.hash[3] = 0xa54ff53a;
  local_4a0.hash[4] = 0x510e527f;
  local_4a0.hash[5] = 0x9b05688c;
  local_4a0.hash[6] = 0x1f83d9ab;
  local_4a0.hash[7] = 0x5be0cd19;
  for (; len != 0; len = len - (long)iVar49) {
    uVar51 = 0x400;
    if (len < 0x400) {
      uVar51 = len;
    }
    iVar49 = (*src->_vptr_CVmDataSource[3])(src,local_438,uVar51);
    if (iVar49 == 0) break;
    sha256_hash((uchar *)local_438,(long)iVar49,&local_4a0);
  }
  sha256_end((uchar *)local_438,&local_4a0);
  auVar48 = _DAT_002a2320;
  auVar47 = _DAT_002a2310;
  auVar46 = _DAT_002a22b0;
  lVar50 = 0;
  do {
    uVar51 = *(ulong *)((long)local_438 + lVar50);
    bVar111 = (byte)uVar51;
    bVar99 = (byte)(uVar51 >> 8);
    bVar101 = (byte)(uVar51 >> 0x10);
    bVar103 = (byte)(uVar51 >> 0x18);
    bVar105 = (byte)(uVar51 >> 0x20);
    bVar107 = (byte)(uVar51 >> 0x28);
    bVar109 = (byte)(uVar51 >> 0x30);
    bVar26 = (byte)(uVar51 >> 0x38);
    auVar95[0] = -((byte)((0x9f < bVar111) * -0x61 | (0x9f >= bVar111) * bVar111) == bVar111);
    cVar100 = -((byte)((0x9f < bVar99) * -0x61 | (0x9f >= bVar99) * bVar99) == bVar99);
    cVar102 = -((byte)((0x9f < bVar101) * -0x61 | (0x9f >= bVar101) * bVar101) == bVar101);
    cVar104 = -((byte)((0x9f < bVar103) * -0x61 | (0x9f >= bVar103) * bVar103) == bVar103);
    cVar106 = -((byte)((0x9f < bVar105) * -0x61 | (0x9f >= bVar105) * bVar105) == bVar105);
    cVar108 = -((byte)((0x9f < bVar107) * -0x61 | (0x9f >= bVar107) * bVar107) == bVar107);
    cVar110 = -((byte)((0x9f < bVar109) * -0x61 | (0x9f >= bVar109) * bVar109) == bVar109);
    bVar111 = -((byte)((0x9f < bVar26) * -0x61 | (0x9f >= bVar26) * bVar26) == bVar26);
    auVar89._0_9_ = CONCAT18(0xff,(ulong)bVar111 << 0x38);
    auVar86._0_10_ = CONCAT19(0xff,auVar89._0_9_);
    auVar86[10] = 0xff;
    auVar87[0xb] = 0xff;
    auVar87._0_11_ = auVar86;
    auVar88[0xc] = 0xff;
    auVar88._0_12_ = auVar87;
    auVar94[0xd] = 0xff;
    auVar94._0_13_ = auVar88;
    auVar27._8_6_ = 0;
    auVar27._0_8_ = uVar51;
    auVar27[0xe] = bVar26;
    auVar29._8_4_ = 0;
    auVar29._0_8_ = uVar51;
    auVar29[0xc] = bVar109;
    auVar29._13_2_ = auVar27._13_2_;
    auVar30._8_4_ = 0;
    auVar30._0_8_ = uVar51;
    auVar30._12_3_ = auVar29._12_3_;
    auVar32._8_2_ = 0;
    auVar32._0_8_ = uVar51;
    auVar32[10] = bVar107;
    auVar32._11_4_ = auVar30._11_4_;
    auVar35._8_2_ = 0;
    auVar35._0_8_ = uVar51;
    auVar35._10_5_ = auVar32._10_5_;
    auVar36[8] = bVar105;
    auVar36._0_8_ = uVar51;
    auVar36._9_6_ = auVar35._9_6_;
    auVar39._7_8_ = 0;
    auVar39._0_7_ = auVar36._8_7_;
    Var40 = CONCAT81(SUB158(auVar39 << 0x40,7),bVar103);
    auVar43._9_6_ = 0;
    auVar43._0_9_ = Var40;
    auVar41._1_10_ = SUB1510(auVar43 << 0x30,5);
    auVar41[0] = bVar101;
    auVar44._11_4_ = 0;
    auVar44._0_11_ = auVar41;
    auVar37[2] = bVar99;
    auVar37._0_2_ = (ushort)uVar51;
    auVar37._3_12_ = SUB1512(auVar44 << 0x20,3);
    auVar38._2_13_ = auVar37._2_13_;
    auVar38._0_2_ = (ushort)uVar51 & 0xff;
    uVar61 = (ushort)Var40;
    auVar28._10_2_ = 0;
    auVar28._0_10_ = auVar38._0_10_;
    auVar28._12_2_ = uVar61;
    uVar45 = CONCAT42(auVar28._10_4_,auVar41._0_2_);
    auVar42._6_8_ = 0;
    auVar42._0_6_ = uVar45;
    auVar33._4_2_ = auVar37._2_2_;
    auVar33._0_4_ = auVar38._0_4_;
    auVar33._6_8_ = SUB148(auVar42 << 0x40,6);
    auVar58._0_4_ = auVar38._0_4_ & 0xffff;
    auVar58._4_10_ = auVar33._4_10_;
    auVar58._14_2_ = 0;
    auVar113._2_2_ = 0;
    auVar113._0_2_ = auVar36._8_2_;
    auVar113._4_2_ = auVar32._10_2_;
    auVar113._6_2_ = 0;
    auVar113._8_2_ = auVar29._12_2_;
    auVar113._10_2_ = 0;
    auVar113[0xc] = bVar26;
    auVar113._13_3_ = 0;
    auVar97._0_4_ = CONCAT22(0,auVar36._8_2_ >> 4);
    uVar31 = auVar32._10_2_ >> 4;
    auVar97._4_2_ = uVar31;
    auVar97._6_2_ = 0;
    uVar34 = auVar29._12_2_ >> 4;
    auVar97._8_2_ = uVar34;
    auVar97._10_2_ = 0;
    bVar26 = bVar26 >> 4;
    auVar97[0xc] = bVar26;
    auVar97._13_3_ = 0;
    auVar112._0_4_ = auVar58._0_4_ >> 4;
    auVar112._4_4_ = auVar33._4_4_ >> 4;
    auVar112._8_4_ = (uint)uVar45 >> 4;
    uVar61 = uVar61 >> 4;
    auVar112._12_2_ = uVar61;
    auVar112._14_2_ = 0;
    auVar94[0xe] = bVar111;
    auVar94[0xf] = bVar111;
    auVar93._14_2_ = auVar94._14_2_;
    auVar93[0xd] = cVar110;
    auVar93._0_13_ = auVar88;
    auVar92._13_3_ = auVar93._13_3_;
    auVar92[0xc] = cVar110;
    auVar92._0_12_ = auVar87;
    auVar91._12_4_ = auVar92._12_4_;
    auVar91[0xb] = cVar108;
    auVar91._0_11_ = auVar86;
    auVar90._11_5_ = auVar91._11_5_;
    auVar90[10] = cVar108;
    auVar90._0_10_ = auVar86._0_10_;
    auVar89._10_6_ = auVar90._10_6_;
    auVar89[9] = cVar106;
    auVar95._8_8_ = (undefined8)(CONCAT72(auVar89._9_7_,CONCAT11(cVar106,bVar111)) >> 8);
    auVar95[7] = cVar104;
    auVar95[6] = cVar104;
    auVar95[5] = cVar102;
    auVar95[4] = cVar102;
    auVar95[3] = cVar100;
    auVar95[2] = cVar100;
    auVar95[1] = auVar95[0];
    auVar95 = auVar95 ^ _DAT_002a2350;
    auVar78._0_4_ = -(uint)((int)(auVar97._0_4_ - 10 ^ 0x80000000) < -0x7ffffffa);
    auVar78._4_4_ = -(uint)((int)(uVar31 - 10 ^ 0x80000000) < -0x7ffffffa);
    auVar78._8_4_ = -(uint)((int)(uVar34 - 10 ^ 0x80000000) < -0x7ffffffa);
    auVar78._12_4_ = -(uint)((int)(bVar26 - 10 ^ 0x80000000) < -0x7ffffffa);
    auVar74._0_4_ = -(uint)((int)(auVar112._0_4_ - 10 ^ 0x80000000) < -0x7ffffffa);
    auVar74._4_4_ = -(uint)((int)(auVar112._4_4_ - 10 ^ 0x80000000) < -0x7ffffffa);
    auVar74._8_4_ = -(uint)((int)(auVar112._8_4_ - 10 ^ 0x80000000) < -0x7ffffffa);
    auVar74._12_4_ = -(uint)((int)(uVar61 - 10 ^ 0x80000000) < -0x7ffffffa);
    auVar114._0_4_ = auVar112._0_4_ + 0x37;
    auVar114._4_4_ = auVar112._4_4_ + 0x37;
    auVar114._8_4_ = auVar112._8_4_ + 0x37;
    auVar114._12_4_ = uVar61 + 0x37;
    auVar115._0_4_ = auVar97._0_4_ + 0x37;
    auVar115._4_4_ = uVar31 + 0x37;
    auVar115._8_4_ = uVar34 + 0x37;
    auVar115._12_4_ = bVar26 + 0x37;
    auVar96._2_2_ = auVar95._8_2_;
    auVar96._0_2_ = auVar95._8_2_;
    auVar96._4_2_ = auVar95._10_2_;
    auVar96._6_2_ = auVar95._10_2_;
    auVar96._8_2_ = auVar95._12_2_;
    auVar96._10_2_ = auVar95._12_2_;
    auVar96._14_2_ = auVar95._14_2_;
    auVar96._12_2_ = auVar96._14_2_;
    auVar119._0_12_ = auVar95._0_12_;
    auVar119._12_2_ = auVar95._6_2_;
    auVar119._14_2_ = auVar95._6_2_;
    auVar118._12_4_ = auVar119._12_4_;
    auVar118._0_10_ = auVar95._0_10_;
    auVar118._10_2_ = auVar95._4_2_;
    auVar117._10_6_ = auVar118._10_6_;
    auVar117._0_8_ = auVar95._0_8_;
    auVar117._8_2_ = auVar95._4_2_;
    auVar116._8_8_ = auVar117._8_8_;
    auVar116._6_2_ = auVar95._2_2_;
    auVar116._4_2_ = auVar95._2_2_;
    auVar116._0_2_ = auVar95._0_2_;
    auVar116._2_2_ = auVar116._0_2_;
    auVar97 = ~auVar96 & (auVar97 | auVar48) | (~auVar78 & auVar47 | auVar115 & auVar78) & auVar96;
    auVar120 = ~auVar116 & (auVar112 | auVar48) |
               (~auVar74 & auVar47 | auVar114 & auVar74) & auVar116;
    auVar113 = auVar113 & _DAT_002a2330;
    auVar58 = auVar58 & _DAT_002a2330;
    uVar77 = auVar58._0_4_;
    uVar83 = auVar58._4_4_;
    iVar84 = auVar58._8_4_;
    iVar85 = auVar58._12_4_;
    uVar63 = auVar113._0_4_;
    uVar72 = auVar113._4_4_;
    iVar49 = auVar113._8_4_;
    iVar73 = auVar113._12_4_;
    auVar75._0_4_ = -(uint)((int)(uVar63 - 10 ^ 0x80000000) < -0x7ffffffa);
    auVar75._4_4_ = -(uint)((int)(uVar72 - 10 ^ 0x80000000) < -0x7ffffffa);
    auVar75._8_4_ = -(uint)((int)(iVar49 - 10U ^ 0x80000000) < -0x7ffffffa);
    auVar75._12_4_ = -(uint)((int)(iVar73 - 10U ^ 0x80000000) < -0x7ffffffa);
    auVar69._0_4_ = -(uint)((int)(uVar77 - 10 ^ 0x80000000) < -0x7ffffffa);
    auVar69._4_4_ = -(uint)((int)(uVar83 - 10 ^ 0x80000000) < -0x7ffffffa);
    auVar69._8_4_ = -(uint)((int)(iVar84 - 10U ^ 0x80000000) < -0x7ffffffa);
    auVar69._12_4_ = -(uint)((int)(iVar85 - 10U ^ 0x80000000) < -0x7ffffffa);
    auVar79._0_4_ = uVar77 + 0x37;
    auVar79._4_4_ = uVar83 + 0x37;
    auVar79._8_4_ = iVar84 + 0x37;
    auVar79._12_4_ = iVar85 + 0x37;
    auVar80._0_4_ = uVar63 + 0x37;
    auVar80._4_4_ = uVar72 + 0x37;
    auVar80._8_4_ = iVar49 + 0x37;
    auVar80._12_4_ = iVar73 + 0x37;
    auVar81._0_4_ = -(uint)(9 < uVar63);
    auVar81._4_4_ = -(uint)(9 < uVar72);
    auVar81._8_4_ = -(uint)(9 < iVar49);
    auVar81._12_4_ = -(uint)(9 < iVar73);
    auVar82 = ~auVar81 & (auVar113 | auVar48) | (~auVar75 & auVar47 | auVar80 & auVar75) & auVar81;
    auVar76._0_4_ = -(uint)(9 < uVar77);
    auVar76._4_4_ = -(uint)(9 < uVar83);
    auVar76._8_4_ = -(uint)(9 < iVar84);
    auVar76._12_4_ = -(uint)(9 < iVar85);
    auVar58 = ~auVar76 & (auVar58 | auVar48) | (~auVar69 & auVar47 | auVar79 & auVar69) & auVar76;
    auVar59._0_8_ = auVar120._0_8_;
    auVar59._8_4_ = auVar120._4_4_;
    auVar59._12_4_ = auVar58._4_4_;
    auVar60._8_8_ = auVar59._8_8_;
    auVar60._0_4_ = auVar120._0_4_;
    auVar60._4_4_ = auVar58._0_4_;
    auVar121._4_4_ = auVar58._8_4_;
    auVar121._0_4_ = auVar120._8_4_;
    auVar121._8_4_ = auVar120._12_4_;
    auVar121._12_4_ = auVar58._12_4_;
    auVar120._0_8_ = auVar97._0_8_;
    auVar120._8_4_ = auVar97._4_4_;
    auVar120._12_4_ = auVar82._4_4_;
    auVar70._8_8_ = auVar120._8_8_;
    auVar70._0_4_ = auVar97._0_4_;
    auVar70._4_4_ = auVar82._0_4_;
    auVar98._4_4_ = auVar82._8_4_;
    auVar98._0_4_ = auVar97._8_4_;
    auVar98._8_4_ = auVar97._12_4_;
    auVar98._12_4_ = auVar82._12_4_;
    auVar98 = auVar98 & auVar46;
    auVar70 = auVar70 & auVar46;
    sVar12 = auVar70._0_2_;
    cVar2 = (0 < sVar12) * (sVar12 < 0x100) * auVar70[0] - (0xff < sVar12);
    sVar12 = auVar70._2_2_;
    sVar62 = CONCAT11((0 < sVar12) * (sVar12 < 0x100) * auVar70[2] - (0xff < sVar12),cVar2);
    sVar12 = auVar70._4_2_;
    cVar100 = (0 < sVar12) * (sVar12 < 0x100) * auVar70[4] - (0xff < sVar12);
    sVar12 = auVar70._6_2_;
    uVar64 = CONCAT13((0 < sVar12) * (sVar12 < 0x100) * auVar70[6] - (0xff < sVar12),
                      CONCAT12(cVar100,sVar62));
    sVar12 = auVar70._8_2_;
    cVar102 = (0 < sVar12) * (sVar12 < 0x100) * auVar70[8] - (0xff < sVar12);
    sVar12 = auVar70._10_2_;
    uVar65 = CONCAT15((0 < sVar12) * (sVar12 < 0x100) * auVar70[10] - (0xff < sVar12),
                      CONCAT14(cVar102,uVar64));
    sVar12 = auVar70._12_2_;
    cVar104 = (0 < sVar12) * (sVar12 < 0x100) * auVar70[0xc] - (0xff < sVar12);
    sVar12 = auVar70._14_2_;
    uVar66 = CONCAT17((0 < sVar12) * (sVar12 < 0x100) * auVar70[0xe] - (0xff < sVar12),
                      CONCAT16(cVar104,uVar65));
    sVar12 = auVar98._0_2_;
    cVar106 = (0 < sVar12) * (sVar12 < 0x100) * auVar98[0] - (0xff < sVar12);
    sVar12 = auVar98._2_2_;
    auVar67._0_10_ =
         CONCAT19((0 < sVar12) * (sVar12 < 0x100) * auVar98[2] - (0xff < sVar12),
                  CONCAT18(cVar106,uVar66));
    sVar12 = auVar98._4_2_;
    cVar108 = (0 < sVar12) * (sVar12 < 0x100) * auVar98[4] - (0xff < sVar12);
    auVar67[10] = cVar108;
    sVar12 = auVar98._6_2_;
    auVar67[0xb] = (0 < sVar12) * (sVar12 < 0x100) * auVar98[6] - (0xff < sVar12);
    sVar12 = auVar98._8_2_;
    cVar110 = (0 < sVar12) * (sVar12 < 0x100) * auVar98[8] - (0xff < sVar12);
    auVar68[0xc] = cVar110;
    auVar68._0_12_ = auVar67;
    sVar12 = auVar98._10_2_;
    auVar68[0xd] = (0 < sVar12) * (sVar12 < 0x100) * auVar98[10] - (0xff < sVar12);
    sVar12 = auVar98._12_2_;
    cVar3 = (0 < sVar12) * (sVar12 < 0x100) * auVar98[0xc] - (0xff < sVar12);
    auVar71[0xe] = cVar3;
    auVar71._0_14_ = auVar68;
    sVar12 = auVar98._14_2_;
    auVar71[0xf] = (0 < sVar12) * (sVar12 < 0x100) * auVar98[0xe] - (0xff < sVar12);
    auVar121 = auVar121 & auVar46;
    auVar60 = auVar60 & auVar46;
    sVar12 = auVar60._0_2_;
    cVar4 = (0 < sVar12) * (sVar12 < 0x100) * auVar60[0] - (0xff < sVar12);
    sVar12 = auVar60._2_2_;
    sVar52 = CONCAT11((0 < sVar12) * (sVar12 < 0x100) * auVar60[2] - (0xff < sVar12),cVar4);
    sVar12 = auVar60._4_2_;
    cVar5 = (0 < sVar12) * (sVar12 < 0x100) * auVar60[4] - (0xff < sVar12);
    sVar12 = auVar60._6_2_;
    uVar53 = CONCAT13((0 < sVar12) * (sVar12 < 0x100) * auVar60[6] - (0xff < sVar12),
                      CONCAT12(cVar5,sVar52));
    sVar12 = auVar60._8_2_;
    cVar6 = (0 < sVar12) * (sVar12 < 0x100) * auVar60[8] - (0xff < sVar12);
    sVar12 = auVar60._10_2_;
    uVar54 = CONCAT15((0 < sVar12) * (sVar12 < 0x100) * auVar60[10] - (0xff < sVar12),
                      CONCAT14(cVar6,uVar53));
    sVar12 = auVar60._12_2_;
    cVar7 = (0 < sVar12) * (sVar12 < 0x100) * auVar60[0xc] - (0xff < sVar12);
    sVar12 = auVar60._14_2_;
    uVar55 = CONCAT17((0 < sVar12) * (sVar12 < 0x100) * auVar60[0xe] - (0xff < sVar12),
                      CONCAT16(cVar7,uVar54));
    sVar12 = auVar121._0_2_;
    cVar8 = (0 < sVar12) * (sVar12 < 0x100) * auVar121[0] - (0xff < sVar12);
    sVar12 = auVar121._2_2_;
    auVar56._0_10_ =
         CONCAT19((0 < sVar12) * (sVar12 < 0x100) * auVar121[2] - (0xff < sVar12),
                  CONCAT18(cVar8,uVar55));
    sVar12 = auVar121._4_2_;
    cVar9 = (0 < sVar12) * (sVar12 < 0x100) * auVar121[4] - (0xff < sVar12);
    auVar56[10] = cVar9;
    sVar12 = auVar121._6_2_;
    auVar56[0xb] = (0 < sVar12) * (sVar12 < 0x100) * auVar121[6] - (0xff < sVar12);
    sVar12 = auVar121._8_2_;
    cVar10 = (0 < sVar12) * (sVar12 < 0x100) * auVar121[8] - (0xff < sVar12);
    auVar57[0xc] = cVar10;
    auVar57._0_12_ = auVar56;
    sVar12 = auVar121._10_2_;
    auVar57[0xd] = (0 < sVar12) * (sVar12 < 0x100) * auVar121[10] - (0xff < sVar12);
    sVar12 = auVar121._12_2_;
    cVar11 = (0 < sVar12) * (sVar12 < 0x100) * auVar121[0xc] - (0xff < sVar12);
    auVar82[0xe] = cVar11;
    auVar82._0_14_ = auVar57;
    sVar12 = auVar121._14_2_;
    auVar82[0xf] = (0 < sVar12) * (sVar12 < 0x100) * auVar121[0xe] - (0xff < sVar12);
    sVar12 = (short)((uint)uVar53 >> 0x10);
    sVar13 = (short)((uint6)uVar54 >> 0x20);
    sVar14 = (short)((ulong)uVar55 >> 0x30);
    sVar15 = (short)((unkuint10)auVar56._0_10_ >> 0x40);
    sVar16 = auVar56._10_2_;
    sVar17 = auVar57._12_2_;
    sVar18 = auVar82._14_2_;
    sVar19 = (short)((uint)uVar64 >> 0x10);
    sVar20 = (short)((uint6)uVar65 >> 0x20);
    sVar21 = (short)((ulong)uVar66 >> 0x30);
    sVar22 = (short)((unkuint10)auVar67._0_10_ >> 0x40);
    sVar23 = auVar67._10_2_;
    sVar24 = auVar68._12_2_;
    sVar25 = auVar71._14_2_;
    pcVar1 = buf + lVar50 * 2;
    *pcVar1 = (0 < sVar52) * (sVar52 < 0x100) * cVar4 - (0xff < sVar52);
    pcVar1[1] = (0 < sVar12) * (sVar12 < 0x100) * cVar5 - (0xff < sVar12);
    pcVar1[2] = (0 < sVar13) * (sVar13 < 0x100) * cVar6 - (0xff < sVar13);
    pcVar1[3] = (0 < sVar14) * (sVar14 < 0x100) * cVar7 - (0xff < sVar14);
    pcVar1[4] = (0 < sVar15) * (sVar15 < 0x100) * cVar8 - (0xff < sVar15);
    pcVar1[5] = (0 < sVar16) * (sVar16 < 0x100) * cVar9 - (0xff < sVar16);
    pcVar1[6] = (0 < sVar17) * (sVar17 < 0x100) * cVar10 - (0xff < sVar17);
    pcVar1[7] = (0 < sVar18) * (sVar18 < 0x100) * cVar11 - (0xff < sVar18);
    pcVar1[8] = (0 < sVar62) * (sVar62 < 0x100) * cVar2 - (0xff < sVar62);
    pcVar1[9] = (0 < sVar19) * (sVar19 < 0x100) * cVar100 - (0xff < sVar19);
    pcVar1[10] = (0 < sVar20) * (sVar20 < 0x100) * cVar102 - (0xff < sVar20);
    pcVar1[0xb] = (0 < sVar21) * (sVar21 < 0x100) * cVar104 - (0xff < sVar21);
    pcVar1[0xc] = (0 < sVar22) * (sVar22 < 0x100) * cVar106 - (0xff < sVar22);
    pcVar1[0xd] = (0 < sVar23) * (sVar23 < 0x100) * cVar108 - (0xff < sVar23);
    pcVar1[0xe] = (0 < sVar24) * (sVar24 < 0x100) * cVar110 - (0xff < sVar24);
    pcVar1[0xf] = (0 < sVar25) * (sVar25 < 0x100) * cVar3 - (0xff < sVar25);
    lVar50 = lVar50 + 8;
  } while (lVar50 != 0x20);
  buf[0x40] = '\0';
  return;
}

Assistant:

void sha256_datasrc(char *buf, CVmDataSource *src, unsigned long len)
{
    /* set up the hash accumulator */
    sha256_ctx ctx;
    sha256_begin(&ctx);

    /* feed the selected range of bytes into the hash */
    while (len != 0)
    {
        /* get a chunk up to one buffer-full, or the total remaining */
        unsigned char buf[1024];
        size_t cur = (len > sizeof(buf) ? sizeof(buf) : (size_t)len);

        /* read the chunk */
        if (cur != 0)
            cur = src->readc(buf, cur);

        /* if there's nothing left, we're done */
        if (cur == 0)
            break;

        /* feed this chunk into the hash */
        sha256_hash(buf, cur, &ctx);

        /* deduct this chunk from the remaining length */
        len -= cur;
    }

    /* calculate the hash result */
    const int HASH_BYTES = 32;
    unsigned char hash[HASH_BYTES];
    sha256_end(hash, &ctx);

    /* convert the binary hash to printable hex digits */
    char *bufp = buf;
    for (int i = 0 ; i < HASH_BYTES ; ++i, bufp += 2)
        byte_to_xdigits(bufp, hash[i]);

    /* null-terminate the string */
    *bufp = '\0';
}